

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  TransformerLinLog *this_00;
  bool bVar1;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImRect local_60;
  ImPlotPoint local_50;
  ImVec2 local_3c;
  ImVec2 P2;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  StairsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLog> *this_local;
  
  this_00 = this->Transformer;
  P2.x = (float)prim;
  unique0x100001f0 = uv;
  local_50 = GetterXsYs<signed_char>::operator()(this->Getter,prim + 1);
  local_3c = TransformerLinLog::operator()(this_00,&local_50);
  local_68 = ImMin(&this->P1,&local_3c);
  local_70 = ImMax(&this->P1,&local_3c);
  ImRect::ImRect(&local_60,&local_68,&local_70);
  bVar1 = ImRect::Overlaps(cull_rect,&local_60);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    this->P1 = local_3c;
  }
  else {
    ImVec2::ImVec2(&local_78,(this->P1).x,(this->P1).y + this->HalfWeight);
    ImVec2::ImVec2(&local_80,local_3c.x,(this->P1).y - this->HalfWeight);
    local_88 = *stack0xffffffffffffffd0;
    AddRectFilled(&local_78,&local_80,this->Col,DrawList,local_88);
    ImVec2::ImVec2(&local_90,local_3c.x - this->HalfWeight,local_3c.y);
    ImVec2::ImVec2(&local_98,local_3c.x + this->HalfWeight,(this->P1).y);
    AddRectFilled(&local_90,&local_98,this->Col,DrawList,*stack0xffffffffffffffd0);
    this->P1 = local_3c;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }